

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::TraverseSchema::traverseAttributeDecl
          (TraverseSchema *this,DOMElement *elem,ComplexTypeInfo *typeInfo,bool topLevel)

{
  short sVar1;
  SchemaInfo *pSVar2;
  XMLStringPool *pXVar3;
  RefHashTableOf<xercesc_4_0::XMLAttDef,_xercesc_4_0::StringHasher> *this_00;
  byte bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  XMLCh *src;
  XMLCh *pXVar9;
  XMLCh *defaultVal;
  XMLCh *pXVar10;
  XMLCh *str1;
  XMLCh *type;
  DOMElement *pDVar11;
  DOMNode *node;
  undefined4 extraout_var;
  XSAnnotation *pXVar12;
  XMLSize_t count;
  SchemaAttDef *pSVar13;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  XercesAttGroupInfo *pXVar14;
  XMLCh *pXVar15;
  DatatypeValidator *pDVar16;
  bool bVar17;
  bool bVar18;
  AttTypes local_bc;
  DatatypeValidator *local_a0;
  XMLCh *local_88;
  XMLCh *local_80;
  XMLCh *local_78;
  uint local_6c;
  XSAnnotation *local_68;
  ArrayJanitor<char16_t> tempURIName;
  NamespaceScopeManager nsMgr;
  
  NamespaceScopeManager::NamespaceScopeManager(&nsMgr,elem,this->fSchemaInfo,this);
  src = getElementAttValue(this,elem,(XMLCh *)SchemaSymbols::fgATT_NAME,NCName);
  pXVar9 = getElementAttValue(this,elem,L"ref",QName);
  if (src == (XMLCh *)0x0) {
    bVar17 = false;
  }
  else {
    bVar17 = *src != L'\0';
  }
  if (pXVar9 == (XMLCh *)0x0) {
    bVar18 = true;
  }
  else {
    bVar18 = *pXVar9 == L'\0';
  }
  if ((~bVar18 & 1U) == 0 && !bVar17) {
    iVar7 = 0x10;
  }
  else {
    if ((~topLevel & 1U) != 0 || bVar17) {
      bVar4 = bVar18 ^ 7;
      if (topLevel) {
        bVar4 = 5;
      }
      GeneralAttributeCheck::checkAttributes
                (&this->fAttributeCheck,elem,(ushort)bVar4,this,topLevel,this->fNonXSAttList);
      defaultVal = getElementAttValue(this,elem,(XMLCh *)SchemaSymbols::fgATT_DEFAULT,UnKnown);
      pXVar10 = getElementAttValue(this,elem,(XMLCh *)SchemaSymbols::fgATT_FIXED,UnKnown);
      local_78 = getElementAttValue(this,elem,L"use",UnKnown);
      str1 = getElementAttValue(this,elem,(XMLCh *)SchemaSymbols::fgATT_FORM,UnKnown);
      type = getElementAttValue(this,elem,(XMLCh *)SchemaSymbols::fgATT_TYPE,QName);
      pDVar11 = XUtil::getFirstChildElement(&elem->super_DOMNode);
      node = &checkContent(this,elem,pDVar11,true,true)->super_DOMNode;
      local_68 = this->fAnnotation;
      bVar17 = false;
      for (; node != (DOMNode *)0x0; node = &XUtil::getNextSiblingElement(node)->super_DOMNode) {
        iVar7 = (*node->_vptr_DOMNode[0x18])(node);
        bVar5 = XMLString::equals((XMLCh *)SchemaSymbols::fgELT_SIMPLETYPE,
                                  (XMLCh *)CONCAT44(extraout_var,iVar7));
        if (bVar5) {
          pDVar11 = XUtil::getNextSiblingElement(node);
          bVar17 = (bool)(pDVar11 != (DOMElement *)0x0 | bVar17);
          break;
        }
        bVar17 = true;
      }
      if (bVar17) {
        pXVar15 = src;
        if (src == (XMLCh *)0x0) {
          pXVar15 = pXVar9;
        }
        reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x4e,pXVar15,(XMLCh *)0x0,
                          (XMLCh *)0x0,(XMLCh *)0x0);
      }
      local_80 = pXVar10;
      if (defaultVal != (XMLCh *)0x0) {
        if (pXVar10 != (XMLCh *)0x0) {
          pXVar10 = src;
          if (src == (XMLCh *)0x0) {
            pXVar10 = pXVar9;
          }
          reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x2f,pXVar10,(XMLCh *)0x0,
                            (XMLCh *)0x0,(XMLCh *)0x0);
        }
        pXVar10 = defaultVal;
        if (local_78 == (XMLCh *)0x0) {
          local_78 = (XMLCh *)0x0;
          local_80 = (XMLCh *)0x0;
        }
        else if ((*local_78 == L'\0') ||
                (bVar17 = XMLString::equals(local_78,(XMLCh *)SchemaSymbols::fgATTVAL_OPTIONAL),
                bVar17)) {
          local_80 = (XMLCh *)0x0;
        }
        else {
          pXVar15 = src;
          if (src == (XMLCh *)0x0) {
            pXVar15 = pXVar9;
          }
          local_78 = (XMLCh *)0x0;
          reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x30,pXVar15,(XMLCh *)0x0,
                            (XMLCh *)0x0,(XMLCh *)0x0);
          local_80 = (XMLCh *)0x0;
        }
      }
      if (bVar18 == false && !topLevel) {
        if ((str1 != (XMLCh *)0x0 || type != (XMLCh *)0x0) || node != (DOMNode *)0x0) {
          pXVar10 = pXVar9;
          if (src != (XMLCh *)0x0) {
            pXVar10 = src;
          }
          reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x45,pXVar10,(XMLCh *)0x0,
                            (XMLCh *)0x0,(XMLCh *)0x0);
        }
        processAttributeDeclRef(this,elem,typeInfo,pXVar9,local_78,defaultVal,local_80);
      }
      else {
        pXVar12 = local_68;
        if (((this->fScanner->fGenerateSyntheticAnnotations == true) &&
            (this->fAnnotation == (XSAnnotation *)0x0)) && (this->fNonXSAttList->fCurCount != 0)) {
          pXVar12 = generateSyntheticAnnotation(this,elem,this->fNonXSAttList);
          this->fAnnotation = pXVar12;
          if (local_68 != (XSAnnotation *)0x0) {
            (*(local_68->super_XSerializable)._vptr_XSerializable[1])();
          }
        }
        local_68 = pXVar12;
        count = XMLString::stringLen(src);
        bVar17 = XMLChar1_0::isValidNCName(src,count);
        if ((!bVar17) || (bVar17 = XMLString::equals(src,(XMLCh *)XMLUni::fgXMLNSString), bVar17)) {
          reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x35,
                            (XMLCh *)SchemaSymbols::fgELT_ATTRIBUTE,src,(XMLCh *)0x0,(XMLCh *)0x0);
        }
        else {
          local_6c = this->fEmptyNamespaceURI;
          if (((this->fTargetNSURIString != (XMLCh *)0x0) && (*this->fTargetNSURIString != L'\0'))
             && (((topLevel ||
                  (bVar17 = XMLString::equals(str1,(XMLCh *)SchemaSymbols::fgATTVAL_QUALIFIED),
                  bVar17)) ||
                 (((this->fSchemaInfo->fElemAttrDefaultQualified & 2) != 0 &&
                  ((str1 == (XMLCh *)0x0 || (*str1 == L'\0')))))))) {
            local_6c = this->fTargetNSURI;
          }
          bVar17 = XMLString::equals(this->fTargetNSURIString,(XMLCh *)SchemaSymbols::fgURI_XSI);
          iVar7 = 0x95;
          if (((!bVar17) &&
              ((iVar7 = 0x31, typeInfo == (ComplexTypeInfo *)0x0 ||
               (pSVar13 = ComplexTypeInfo::getAttDef(typeInfo,src,local_6c),
               pSVar13 == (SchemaAttDef *)0x0)))) &&
             ((this->fCurrentAttGroupInfo == (XercesAttGroupInfo *)0x0 ||
              (bVar17 = XercesAttGroupInfo::containsAttribute
                                  (this->fCurrentAttGroupInfo,src,local_6c), !bVar17)))) {
            pSVar2 = this->fSchemaInfo;
            local_bc = Simple;
            if (node == (DOMNode *)0x0) {
              if ((type == (XMLCh *)0x0) || (*type == L'\0')) {
                local_a0 = DatatypeValidatorFactory::getDatatypeValidator
                                     (this->fDatatypeRegistry,
                                      (XMLCh *)SchemaSymbols::fgDT_ANYSIMPLETYPE);
              }
              else {
                checkEnumerationRequiredNotation(this,elem,src,type);
                local_88 = getLocalPart(this,type);
                pXVar9 = getPrefix(this,type);
                pXVar9 = resolvePrefixToURI(this,elem,pXVar9);
                bVar17 = XMLString::equals(pXVar9,(XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
                if (bVar17) {
                  local_a0 = DatatypeValidatorFactory::getDatatypeValidator
                                       (this->fDatatypeRegistry,local_88);
                  if (local_a0 != (DatatypeValidator *)0x0) {
LAB_00319378:
                    bVar17 = XMLString::equals(local_88,L"ID");
                    if (bVar17) {
                      local_bc = ID;
                    }
                    else {
                      bVar17 = XMLString::equals(local_88,(XMLCh *)XMLUni::fgIDRefString);
                      if (bVar17) {
                        local_bc = IDRef;
                      }
                      else {
                        bVar17 = XMLString::equals(local_88,(XMLCh *)XMLUni::fgIDRefsString);
                        if (bVar17) {
                          local_bc = IDRefs;
                        }
                        else {
                          bVar17 = XMLString::equals(local_88,(XMLCh *)XMLUni::fgEntityString);
                          if (bVar17) {
                            local_bc = Entity;
                          }
                          else {
                            bVar17 = XMLString::equals(local_88,(XMLCh *)XMLUni::fgEntitiesString);
                            if (bVar17) {
                              local_bc = Entities;
                            }
                            else {
                              bVar17 = XMLString::equals(local_88,(XMLCh *)XMLUni::fgNmTokenString);
                              if (bVar17) {
                                local_bc = NmToken;
                              }
                              else {
                                bVar17 = XMLString::equals(local_88,(XMLCh *)XMLUni::
                                                  fgNmTokensString);
                                if (bVar17) {
                                  local_bc = NmTokens;
                                }
                                else {
                                  bVar17 = XMLString::equals(local_88,(XMLCh *)XMLUni::
                                                  fgNotationString);
                                  local_bc = (uint)!bVar17 * 2 + Notation;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                    goto LAB_003193d7;
                  }
                  local_bc = Simple;
                }
                else {
                  local_a0 = getAttrDatatypeValidatorNS(this,elem,local_88,pXVar9);
                  local_bc = Simple;
                  for (pDVar16 = local_a0; pDVar16 != (DatatypeValidator *)0x0;
                      pDVar16 = pDVar16->fBaseValidator) {
                    bVar17 = XMLString::equals(pDVar16->fTypeUri,
                                               (XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
                    if (bVar17) {
                      local_88 = pDVar16->fTypeLocalName;
                      goto LAB_00319378;
                    }
                  }
LAB_003193d7:
                  if (local_a0 != (DatatypeValidator *)0x0) goto LAB_00319414;
                }
                reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x33,pXVar9,local_88,src
                                  ,(XMLCh *)0x0);
                local_a0 = (DatatypeValidator *)0x0;
              }
            }
            else {
              if ((type != (XMLCh *)0x0) && (*type != L'\0')) {
                reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x32,src,(XMLCh *)0x0,
                                  (XMLCh *)0x0,(XMLCh *)0x0);
              }
              local_a0 = traverseSimpleTypeDecl(this,(DOMElement *)node,false,0);
            }
LAB_00319414:
            this->fSchemaInfo = pSVar2;
            if ((local_78 == (XMLCh *)0x0) || (*local_78 == L'\0')) {
              bVar17 = false;
LAB_0031945a:
              bVar18 = false;
            }
            else {
              bVar17 = XMLString::equals(local_78,(XMLCh *)SchemaSymbols::fgATTVAL_REQUIRED);
              if (bVar17) {
                bVar17 = true;
                goto LAB_0031945a;
              }
              bVar18 = XMLString::equals(local_78,(XMLCh *)SchemaSymbols::fgATTVAL_PROHIBITED);
              bVar17 = false;
            }
            if (local_a0 == (DatatypeValidator *)0x0) {
              bVar5 = false;
            }
            else {
              bVar5 = local_a0->fType == ID;
            }
            if (((pXVar10 == (XMLCh *)0x0) || (local_bc != Simple)) ||
               (local_a0 == (DatatypeValidator *)0x0)) {
              if (((pXVar10 != (XMLCh *)0x0) &&
                  (local_bc == Entities || (local_bc & ~Entity) == IDRefs)) &&
                 (bVar6 = XMLString::isWSCollapsed(pXVar10), !bVar6)) {
                pXVar9 = XMLString::replicate(pXVar10,this->fMemoryManager);
                ArrayJanitor<char16_t>::ArrayJanitor(&tempURIName,pXVar9,this->fMemoryManager);
                XMLString::collapseWS(pXVar9,this->fMemoryManager);
                pXVar3 = this->fStringPool;
                uVar8 = (*(pXVar3->super_XSerializable)._vptr_XSerializable[5])(pXVar3,pXVar9);
                iVar7 = (*(pXVar3->super_XSerializable)._vptr_XSerializable[10])
                                  (pXVar3,(ulong)uVar8);
                pXVar10 = (XMLCh *)CONCAT44(extraout_var_00,iVar7);
                ArrayJanitor<char16_t>::~ArrayJanitor(&tempURIName);
              }
            }
            else {
              sVar1 = local_a0->fWhiteSpace;
              if (sVar1 == 1) {
                bVar6 = XMLString::isWSReplaced(pXVar10);
LAB_00319559:
                if (bVar6 == false) {
                  pXVar9 = XMLString::replicate(pXVar10,this->fMemoryManager);
                  ArrayJanitor<char16_t>::ArrayJanitor(&tempURIName,pXVar9,this->fMemoryManager);
                  if (sVar1 == 1) {
                    XMLString::replaceWS(pXVar9,this->fMemoryManager);
                  }
                  else {
                    XMLString::collapseWS(pXVar9,this->fMemoryManager);
                  }
                  pXVar3 = this->fStringPool;
                  uVar8 = (*(pXVar3->super_XSerializable)._vptr_XSerializable[5])(pXVar3,pXVar9);
                  iVar7 = (*(pXVar3->super_XSerializable)._vptr_XSerializable[10])
                                    (pXVar3,(ulong)uVar8);
                  pXVar10 = (XMLCh *)CONCAT44(extraout_var_01,iVar7);
                  ArrayJanitor<char16_t>::~ArrayJanitor(&tempURIName);
                }
              }
              else if (sVar1 == 2) {
                bVar6 = XMLString::isWSCollapsed(pXVar10);
                goto LAB_00319559;
              }
              (*(local_a0->super_XSerializable)._vptr_XSerializable[8])
                        (local_a0,pXVar10,this->fSchemaInfo->fValidationContext,this->fMemoryManager
                        );
            }
            if (pXVar10 != (XMLCh *)0x0 && !(bool)(bVar5 ^ 1U)) {
              reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x88,src,(XMLCh *)0x0,
                                (XMLCh *)0x0,(XMLCh *)0x0);
            }
            if (!(bool)(bVar5 ^ 1U) && !topLevel) {
              pXVar14 = this->fCurrentAttGroupInfo;
              if (pXVar14 == (XercesAttGroupInfo *)0x0) {
                iVar7 = 0x89;
                if (typeInfo->fAttWithTypeId == true) goto LAB_0031968a;
                typeInfo->fAttWithTypeId = true;
              }
              else {
                iVar7 = 0x8a;
                if (pXVar14->fTypeWithId != false) {
LAB_0031968a:
                  reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,iVar7,src,(XMLCh *)0x0
                                    ,(XMLCh *)0x0,(XMLCh *)0x0);
                  goto LAB_003190ee;
                }
                pXVar14->fTypeWithId = true;
              }
            }
            pSVar13 = (SchemaAttDef *)XMemory::operator_new(0x68,this->fGrammarPoolMemoryManager);
            SchemaAttDef::SchemaAttDef
                      (pSVar13,L"",src,local_6c,local_bc,Implied,this->fGrammarPoolMemoryManager);
            pSVar13->fDatatypeValidator = local_a0;
            if (bVar18 == false) {
              if (bVar17) {
                if (local_80 == (XMLCh *)0x0) {
                  (pSVar13->super_XMLAttDef).fDefaultType = Required;
                }
                else {
                  (pSVar13->super_XMLAttDef).fDefaultType = Required_And_Fixed;
                }
              }
              else if (local_80 == (XMLCh *)0x0) {
                if (defaultVal != (XMLCh *)0x0) {
                  (pSVar13->super_XMLAttDef).fDefaultType = DefAttTypes_Min;
                }
              }
              else {
                (pSVar13->super_XMLAttDef).fDefaultType = Fixed;
              }
            }
            else {
              (pSVar13->super_XMLAttDef).fDefaultType = DefAttTypes_Max;
            }
            if (pXVar10 != (XMLCh *)0x0) {
              XMLAttDef::setValue((XMLAttDef *)pSVar13,pXVar10);
            }
            if (local_68 != (XSAnnotation *)0x0) {
              SchemaGrammar::putAnnotation(this->fSchemaGrammar,pSVar13,local_68);
            }
            if (topLevel) {
              pXVar3 = this->fStringPool;
              this_00 = this->fAttributeDeclRegistry;
              uVar8 = (*(pXVar3->super_XSerializable)._vptr_XSerializable[5])(pXVar3,src);
              iVar7 = (*(pXVar3->super_XSerializable)._vptr_XSerializable[10])(pXVar3,(ulong)uVar8);
              RefHashTableOf<xercesc_4_0::XMLAttDef,_xercesc_4_0::StringHasher>::put
                        (this_00,(void *)CONCAT44(extraout_var_02,iVar7),(XMLAttDef *)pSVar13);
              pSVar13->fPSVIScope = SCP_GLOBAL;
            }
            else {
              if (typeInfo == (ComplexTypeInfo *)0x0) {
                pXVar14 = this->fCurrentAttGroupInfo;
                if (pXVar14 == (XercesAttGroupInfo *)0x0) goto LAB_00318e8d;
              }
              else {
                ComplexTypeInfo::addAttDef(typeInfo,pSVar13);
                pXVar14 = this->fCurrentAttGroupInfo;
                if (pXVar14 == (XercesAttGroupInfo *)0x0) {
                  pSVar13->fPSVIScope = SCP_LOCAL;
                  goto LAB_00318e8d;
                }
              }
              XercesAttGroupInfo::addAttDef(pXVar14,pSVar13,typeInfo != (ComplexTypeInfo *)0x0);
            }
            goto LAB_00318e8d;
          }
          reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,iVar7,src,(XMLCh *)0x0,
                            (XMLCh *)0x0,(XMLCh *)0x0);
        }
      }
LAB_003190ee:
      if (local_68 != (XSAnnotation *)0x0) {
        (*(local_68->super_XSerializable)._vptr_XSerializable[1])();
      }
      goto LAB_00318e8d;
    }
    iVar7 = 0xf;
  }
  reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,iVar7);
LAB_00318e8d:
  NamespaceScopeManager::~NamespaceScopeManager(&nsMgr);
  return;
}

Assistant:

void TraverseSchema::traverseAttributeDecl(const DOMElement* const elem,
                                           ComplexTypeInfo* const typeInfo,
                                           const bool topLevel) {

    NamespaceScopeManager nsMgr(elem, fSchemaInfo, this);

    const XMLCh*   name = getElementAttValue(elem, SchemaSymbols::fgATT_NAME, DatatypeValidator::NCName);
    const XMLCh*   ref = getElementAttValue(elem, SchemaSymbols::fgATT_REF, DatatypeValidator::QName);
    bool           nameEmpty = (!name || !*name);
    bool           refEmpty = (!ref || !*ref);

    if (nameEmpty && refEmpty) {
        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::NoNameRefAttribute);
        return;
    }

    if (topLevel && nameEmpty) {

        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::TopLevelNoNameAttribute);
        return;
    }

    // ------------------------------------------------------------------
    // Check attributes
    // ------------------------------------------------------------------
    unsigned short scope = (topLevel)
        ? GeneralAttributeCheck::E_AttributeGlobal
        : (refEmpty) ? GeneralAttributeCheck::E_AttributeLocal
                     : GeneralAttributeCheck::E_AttributeRef;

    fAttributeCheck.checkAttributes(elem, scope, this, topLevel, fNonXSAttList);

    const XMLCh* defaultVal = getElementAttValue(elem, SchemaSymbols::fgATT_DEFAULT);
    const XMLCh* fixedVal = getElementAttValue(elem, SchemaSymbols::fgATT_FIXED);
    const XMLCh* useVal = getElementAttValue(elem, SchemaSymbols::fgATT_USE);
    const XMLCh* attForm = getElementAttValue(elem, SchemaSymbols::fgATT_FORM);
    const XMLCh* dvType = getElementAttValue(elem, SchemaSymbols::fgATT_TYPE, DatatypeValidator::QName);
    DOMElement* simpleType = checkContent(elem, XUtil::getFirstChildElement(elem), true);
    Janitor<XSAnnotation> janAnnot(fAnnotation);
    bool         badContent = false;

    while (simpleType != 0) {

        const XMLCh* contentName = simpleType->getLocalName();

        if (XMLString::equals(SchemaSymbols::fgELT_SIMPLETYPE, contentName)) {

            if (XUtil::getNextSiblingElement(simpleType) != 0) {
                badContent = true;
            }
            break;
        }

        badContent = true;
        simpleType = XUtil::getNextSiblingElement(simpleType);
    }

    if (badContent) {
        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::InvalidAttributeContent,
                          (name) ? name : ref);
    }

    if (defaultVal) {

        if (fixedVal) {

            fixedVal = 0;
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::AttributeDefaultFixedValue,
                              (name) ? name : ref);
        }

        if ((useVal && *useVal)
            && !XMLString::equals(useVal, SchemaSymbols::fgATTVAL_OPTIONAL)) {

            useVal = 0;
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::NotOptionalDefaultAttValue,
                              (name) ? name : ref);
        }
    }

    // processing ref
    if (!refEmpty && !topLevel) {

        // Check ref representation OK - 3.2.3::3.2
        if (attForm || dvType || (simpleType != 0)) {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::AttributeRefContentError,
                              (name) ? name : ref);
        }

        processAttributeDeclRef(elem, typeInfo, ref, useVal, defaultVal, fixedVal);
        return;
    }

    if (fScanner->getGenerateSyntheticAnnotations() && !fAnnotation && fNonXSAttList->size())
    {
        fAnnotation = generateSyntheticAnnotation(elem, fNonXSAttList);
        janAnnot.reset(fAnnotation);
    }

    // processing 'name'
    if (!XMLChar1_0::isValidNCName(name, XMLString::stringLen(name))
        || XMLString::equals(name, XMLUni::fgXMLNSString)) {

        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::InvalidDeclarationName, SchemaSymbols::fgELT_ATTRIBUTE, name);
        return;
    }

    // Check for duplicate declaration
    const XMLCh* qualified = SchemaSymbols::fgATTVAL_QUALIFIED;
    int uriIndex = fEmptyNamespaceURI;

    if ((fTargetNSURIString && *fTargetNSURIString)
        && (topLevel || XMLString::equals(attForm, qualified)
            || ((fSchemaInfo->getElemAttrDefaultQualified() & Attr_Def_Qualified)
                && (!attForm || !*attForm)))) {
        uriIndex = fTargetNSURI;
    }

    // make sure that attribute namespace is not xsi uri
    if (XMLString::equals(fTargetNSURIString, SchemaSymbols::fgURI_XSI)) {

        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::InvalidAttTNS, name);
        return;
    }

    if (typeInfo && typeInfo->getAttDef(name, uriIndex) != 0) {

        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::DuplicateAttribute, name);
        return;
    }
    else if (fCurrentAttGroupInfo && fCurrentAttGroupInfo->containsAttribute(name, uriIndex)) {

        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::DuplicateAttribute, name);
        return;
    }

    DatatypeValidator*  dv = 0;
    XMLAttDef::AttTypes attType = XMLAttDef::Simple;
    SchemaInfo* saveInfo = fSchemaInfo;

    if (simpleType != 0) {

        if (dvType && *dvType) {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::AttributeWithTypeAndSimpleType, name);
        }

        dv = traverseSimpleTypeDecl(simpleType, false);
    }
    else if (!dvType || !*dvType) {
        dv = fDatatypeRegistry->getDatatypeValidator(SchemaSymbols::fgDT_ANYSIMPLETYPE);
    }
    else {

        checkEnumerationRequiredNotation(elem, name, dvType);

        const XMLCh* localPart = getLocalPart(dvType);
        const XMLCh* prefix = getPrefix(dvType);
        const XMLCh* typeURI = resolvePrefixToURI(elem, prefix);
        DatatypeValidator*  dvBack = 0;

        if (XMLString::equals(typeURI, SchemaSymbols::fgURI_SCHEMAFORSCHEMA)) {
            dv = fDatatypeRegistry->getDatatypeValidator(localPart);
            dvBack = dv;
        }
        else { //isn't of the schema for schemas namespace...

            dv = getAttrDatatypeValidatorNS(elem, localPart, typeURI);
            dvBack = dv;

            while(dv != 0 && !XMLString::equals(dv->getTypeUri(), SchemaSymbols::fgURI_SCHEMAFORSCHEMA)) {
                dv = dv->getBaseValidator();
            }

            if(dv)
                localPart = dv->getTypeLocalName();
        }

        if(dv) {
            if (XMLString::equals(localPart,XMLUni::fgIDString)) {
                attType = XMLAttDef::ID;
            }
            else if (XMLString::equals(localPart,XMLUni::fgIDRefString)) {
                attType = XMLAttDef::IDRef;
            }
            else if (XMLString::equals(localPart,XMLUni::fgIDRefsString)) {
                attType = XMLAttDef::IDRefs;
            }
            else if (XMLString::equals(localPart,XMLUni::fgEntityString)) {
                attType = XMLAttDef::Entity;
            }
            else if (XMLString::equals(localPart,XMLUni::fgEntitiesString)) {
                attType = XMLAttDef::Entities;
            }
            else if (XMLString::equals(localPart,XMLUni::fgNmTokenString)) {
                attType = XMLAttDef::NmToken;
            }
            else if (XMLString::equals(localPart,XMLUni::fgNmTokensString)) {
                attType = XMLAttDef::NmTokens;
            }
            else if (XMLString::equals(localPart,XMLUni::fgNotationString)) {
                attType = XMLAttDef::Notation;
            }
            else {
                attType = XMLAttDef::Simple;
            }
        }
        else
            attType = XMLAttDef::Simple;

        dv = dvBack;

        if (!dv) {
            reportSchemaError
            (
                elem
                , XMLUni::fgXMLErrDomain
                , XMLErrs::AttributeSimpleTypeNotFound
                , typeURI
                , localPart
                , name
            );
        }
    }

    // restore schema information, if necessary
    fSchemaInfo = saveInfo;

    bool required = false;
    bool prohibited = false;

    if (useVal && *useVal) {

        if (XMLString::equals(useVal, SchemaSymbols::fgATTVAL_REQUIRED)) {
            required = true;
        }
        else if (XMLString::equals(useVal, SchemaSymbols::fgATTVAL_PROHIBITED)) {
            prohibited = true;
        }
    }

    // validate fixed/default values
    const XMLCh* valueToCheck = defaultVal ? defaultVal : fixedVal;
    bool  ofTypeID = (dv && dv->getType() == DatatypeValidator::ID);

    if (attType == XMLAttDef::Simple && dv && valueToCheck) {

        short wsFacet = dv->getWSFacet();
        if((wsFacet == DatatypeValidator::REPLACE && !XMLString::isWSReplaced(valueToCheck)) ||
           (wsFacet == DatatypeValidator::COLLAPSE && !XMLString::isWSCollapsed(valueToCheck)))
        {
            XMLCh* normalizedValue=XMLString::replicate(valueToCheck, fMemoryManager);
            ArrayJanitor<XMLCh> tempURIName(normalizedValue, fMemoryManager);
            if(wsFacet == DatatypeValidator::REPLACE)
                XMLString::replaceWS(normalizedValue, fMemoryManager);
            else if(wsFacet == DatatypeValidator::COLLAPSE)
                XMLString::collapseWS(normalizedValue, fMemoryManager);
            valueToCheck=fStringPool->getValueForId(fStringPool->addOrFind(normalizedValue));
        }
        try {
            dv->validate(valueToCheck
                      , fSchemaInfo->getValidationContext()
                      , fMemoryManager);
        }
        catch (const XMLException& excep) {
            reportSchemaError(elem, excep);
        }
        catch(const OutOfMemoryException&)
        {
            throw;
        }
        catch(...) {
            reportSchemaError(elem, XMLUni::fgValidityDomain, XMLValid::DatatypeValidationFailure, valueToCheck);
        }
    }
    else if((attType == XMLAttDef::NmTokens || attType==XMLAttDef::IDRefs || attType==XMLAttDef::Entities) &&
            valueToCheck && !XMLString::isWSCollapsed(valueToCheck))
    {
        XMLCh* normalizedValue=XMLString::replicate(valueToCheck, fMemoryManager);
        ArrayJanitor<XMLCh> tempURIName(normalizedValue, fMemoryManager);
        XMLString::collapseWS(normalizedValue, fMemoryManager);
        valueToCheck=fStringPool->getValueForId(fStringPool->addOrFind(normalizedValue));
    }

    if (ofTypeID && valueToCheck) {
        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::AttDeclPropCorrect3, name);
    }

    // check for multiple attributes with type derived from ID
    if (!topLevel && ofTypeID) {

        if (fCurrentAttGroupInfo) {

            if (fCurrentAttGroupInfo->containsTypeWithId()) {

                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::AttGrpPropCorrect3, name);
                return;
            }

            fCurrentAttGroupInfo->setTypeWithId(true);
        }
        else {

            if (typeInfo->containsAttWithTypeId()) {

                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::AttDeclPropCorrect5, name);
                return;
            }

            typeInfo->setAttWithTypeId(true);
        }
    }

    // create SchemaAttDef
    SchemaAttDef* attDef = new (fGrammarPoolMemoryManager) SchemaAttDef
    (
        XMLUni::fgZeroLenString
        , name
        , uriIndex
        , attType
        , XMLAttDef::Implied
        , fGrammarPoolMemoryManager
    );

    attDef->setDatatypeValidator(dv);

    if (prohibited) {
        attDef->setDefaultType(XMLAttDef::Prohibited);
    }
    else if (required) {

        if (fixedVal) {
            attDef->setDefaultType(XMLAttDef::Required_And_Fixed);
        }
        else {
            attDef->setDefaultType(XMLAttDef::Required);
        }
    }
    else {

        if (fixedVal) {
            attDef->setDefaultType(XMLAttDef::Fixed);
        }
        else if (defaultVal) {
            attDef->setDefaultType(XMLAttDef::Default);
        }
    }

    if (valueToCheck) {
        attDef->setValue(valueToCheck);
    }

    if (!janAnnot.isDataNull())
        fSchemaGrammar->putAnnotation(attDef, janAnnot.release());

    if (topLevel)
    {
        fAttributeDeclRegistry->put((void*) fStringPool->getValueForId(fStringPool->addOrFind(name)), attDef);
        attDef->setPSVIScope(PSVIDefs::SCP_GLOBAL);
    }
    else
    {
        if (typeInfo)
        {
            typeInfo->addAttDef(attDef);
            if (!fCurrentAttGroupInfo)
                attDef->setPSVIScope(PSVIDefs::SCP_LOCAL);
        }

        if (fCurrentAttGroupInfo) {
            fCurrentAttGroupInfo->addAttDef(attDef, (typeInfo != 0));
        }
    }
}